

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::setFocus(QGraphicsScene *this,FocusReason focusReason)

{
  QGraphicsScenePrivate *d;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(*(long *)(this + 8) + 0xb9) & 4) == 0) &&
     (0 < *(int *)(*(long *)(this + 8) + 0x1b8))) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QFocusEvent::QFocusEvent((QFocusEvent *)&local_38,FocusIn,focusReason);
    QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_38);
    QFocusEvent::~QFocusEvent((QFocusEvent *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setFocus(Qt::FocusReason focusReason)
{
    Q_D(QGraphicsScene);
    if (d->hasFocus || !isActive())
        return;
    QFocusEvent event(QEvent::FocusIn, focusReason);
    QCoreApplication::sendEvent(this, &event);
}